

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearchBasedMethod.cpp
# Opt level: O2

Type __thiscall
QuantLib::LineSearchBasedMethod::minimize
          (LineSearchBasedMethod *this,Problem *P,EndCriteria *endCriteria,RealType initialStepSize)

{
  RealType RVar1;
  Type TVar2;
  bool bVar3;
  DynamicVector<double,_std::allocator<double>_> *v1;
  size_type __n;
  size_t iteration;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  Type ecType;
  DynamicVector<double,_std::allocator<double>_> prevGradient;
  DynamicVector<double,_std::allocator<double>_> x_;
  size_t maxStationaryStateIterations_;
  DynamicVector<double,_std::allocator<double>_> direction;
  DynamicVector<double,_std::allocator<double>_> sddiff;
  DynamicVector<double,_std::allocator<double>_> d;
  Type local_fc;
  _Vector_base<double,_std::allocator<double>_> local_f8;
  RealType local_e0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  RealType *local_c0;
  RealType local_b8;
  RealType local_b0;
  size_t local_a8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_70;
  RealType local_58;
  undefined8 uStack_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_e0 = initialStepSize;
  local_b8 = EndCriteria::functionEpsilon(endCriteria);
  local_a8 = EndCriteria::maxStationaryStateIterations(endCriteria);
  local_fc = None;
  P->functionValue_ = 0.0;
  P->squaredNorm_ = 0.0;
  P->functionEvaluation_ = 0;
  P->gradientEvaluation_ = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_d8,&(P->currentValue_).data_);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_f8,
             (long)local_d8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->lineSearch_->searchDirection_).data_,&local_f8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f8);
  __n = (long)(this->lineSearch_->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(this->lineSearch_->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_f8,__n,(allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_70,__n,(allocator_type *)&local_88);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,__n,(allocator_type *)&local_a0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a0,__n,(allocator_type *)&local_48);
  RVar1 = Problem::valueAndGradient
                    (P,(DynamicVector<double,_std::allocator<double>_> *)&local_f8,
                     (DynamicVector<double,_std::allocator<double>_> *)&local_d8);
  P->functionValue_ = RVar1;
  RVar1 = Problem::DotProduct(P,(DynamicVector<double,_std::allocator<double>_> *)&local_f8,
                              (DynamicVector<double,_std::allocator<double>_> *)&local_f8);
  P->squaredNorm_ = RVar1;
  OpenMD::operator-((DynamicVector<double,_std::allocator<double>_> *)&local_48,(OpenMD *)&local_f8,
                    v1);
  local_c0 = &P->functionValue_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->lineSearch_->searchDirection_).data_,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  bVar3 = true;
  iteration = 0;
  while( true ) {
    local_58 = P->functionValue_;
    uStack_50 = 0;
    local_b0 = P->squaredNorm_;
    if (!bVar3) {
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)&local_f8,
                 &(this->lineSearch_->gradient_).data_);
    }
    (*this->lineSearch_->_vptr_LineSearch[2])
              (SUB84(local_e0,0),this->lineSearch_,P,&local_fc,endCriteria);
    local_e0 = (RealType)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    if (this->lineSearch_->succeed_ != true) {
      Problem::setCurrentValue(P,(DynamicVector<double,_std::allocator<double>_> *)&local_d8);
      goto LAB_0019c581;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_d8,&(this->lineSearch_->xtd_).data_
              );
    Problem::setCurrentValue(P,(DynamicVector<double,_std::allocator<double>_> *)&local_d8);
    RVar1 = this->lineSearch_->qpt_;
    P->functionValue_ = this->lineSearch_->qt_;
    P->squaredNorm_ = RVar1;
    (*(this->super_OptimizationMethod)._vptr_OptimizationMethod[3])
              (SUB84(local_b0,0),&local_48,this,P,&local_f8);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_a0,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    OpenMD::operator-((DynamicVector<double,_std::allocator<double>_> *)&local_48,
                      (DynamicVector<double,_std::allocator<double>_> *)&local_a0,
                      &this->lineSearch_->searchDirection_);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_88,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lineSearch_->searchDirection_).data_,
               (vector<double,_std::allocator<double>_> *)&local_a0);
    dVar4 = ABS(*local_c0 - local_58);
    if ((dVar4 + dVar4) / (ABS(local_58) + ABS(*local_c0) + 2.220446049250313e-16) < local_b8)
    break;
    bVar3 = EndCriteria::checkMaxIterations(endCriteria,iteration,&local_fc);
    if (bVar3) break;
    Problem::setCurrentValue(P,(DynamicVector<double,_std::allocator<double>_> *)&local_d8);
    iteration = iteration + 1;
    bVar3 = false;
  }
  EndCriteria::checkStationaryFunctionValue(endCriteria,0.0,0.0,&local_a8,&local_fc);
  EndCriteria::checkMaxIterations(endCriteria,iteration,&local_fc);
LAB_0019c581:
  TVar2 = local_fc;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
  return TVar2;
}

Assistant:

EndCriteria::Type LineSearchBasedMethod::minimize(
      Problem& P, const EndCriteria& endCriteria,
      RealType initialStepSize = 1.0) {
    // Initializations
    RealType ftol = endCriteria.functionEpsilon();
    size_t maxStationaryStateIterations_ =
        endCriteria.maxStationaryStateIterations();
    EndCriteria::Type ecType = EndCriteria::None;   // reset end criteria
    P.reset();                                      // reset problem
    DynamicVector<RealType> x_ = P.currentValue();  // store the starting point
    size_t iterationNumber_    = 0;
    // dimension line search
    lineSearch_->searchDirection() = DynamicVector<RealType>(x_.size());
    bool done                      = false;

    // function and squared norm of gradient values;
    RealType fnew, fold, gold2;
    RealType fdiff;
    // classical initial value for line-search step
    // RealType t = 1.0;
    // new initial value for line-search step
    RealType t = initialStepSize;
    // Set gradient g at the size of the optimization problem
    // search direction
    size_t sz = lineSearch_->searchDirection().size();
    DynamicVector<RealType> prevGradient(sz), d(sz), sddiff(sz), direction(sz);
    // Initialize objective function, gradient prevGradient and
    // search direction

    P.setFunctionValue(P.valueAndGradient(prevGradient, x_));
    P.setGradientNormValue(P.DotProduct(prevGradient, prevGradient));
    lineSearch_->searchDirection() = -prevGradient;

    bool first_time = true;
    // Loop over iterations
    do {
      fold  = P.functionValue();
      gold2 = P.gradientNormValue();

      // Linesearch
      if (!first_time) prevGradient = lineSearch_->lastGradient();

      t = (*lineSearch_)(P, ecType, endCriteria, t);

      // don't throw: it can fail just because maxIterations exceeded
      // QL_REQUIRE(lineSearch_->succeed(), "line-search failed!");
      if (lineSearch_->succeed()) {
        // Updates
        // New point
        x_ = lineSearch_->lastX();
        P.setCurrentValue(x_);
        // New function value
        P.setFunctionValue(lineSearch_->lastFunctionValue());
        // New gradient and search direction vectors

        // orthogonalization coef
        P.setGradientNormValue(lineSearch_->lastGradientNorm2());

        // conjugate gradient search direction
        direction = getUpdatedDirection(P, gold2, prevGradient);

        sddiff = direction - lineSearch_->searchDirection();

        lineSearch_->searchDirection() = direction;
        // Now compute accuracy and check end criteria
        // Numerical Recipes exit strategy on fx (see NR in C++, p.423)

        fnew  = P.functionValue();
        fdiff = 2.0 * std::fabs(fnew - fold) /
                (std::fabs(fnew) + std::fabs(fold) +
                 std::numeric_limits<RealType>::epsilon());

        if (fdiff < ftol ||
            endCriteria.checkMaxIterations(iterationNumber_, ecType)) {
          endCriteria.checkStationaryFunctionValue(
              0.0, 0.0, maxStationaryStateIterations_, ecType);
          endCriteria.checkMaxIterations(iterationNumber_, ecType);
          return ecType;
        }
        P.setCurrentValue(x_);  // update problem current value
        ++iterationNumber_;     // Increase iteration number
        first_time = false;
      } else {
        done = true;
      }
    } while (!done);
    P.setCurrentValue(x_);
    return ecType;
  }